

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O1

Result __thiscall Kernel::LPO::lpo(LPO *this,AppliedTerm tt1,AppliedTerm tt2)

{
  AppliedTerm s;
  AppliedTerm s_00;
  AppliedTerm s_01;
  TermList TVar1;
  bool bVar2;
  Result RVar3;
  uint uVar4;
  
  bVar2 = AppliedTerm::equalsShallow(&tt1,tt2);
  TVar1 = tt1.term;
  RVar3 = EQUAL;
  if (!bVar2) {
    if ((tt1.term._content & 1) == 0) {
      if (((undefined1  [24])tt2 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
        RVar3 = PrecedenceOrdering::comparePrecedences
                          (&this->super_PrecedenceOrdering,(Term *)tt1.term._content,
                           (Term *)tt2.term._content);
        if (RVar3 == GREATER) {
          uVar4 = *(uint *)(tt2.term._content + 0xc) & 0xfffffff;
          s_00.aboveVar = tt1.aboveVar;
          s_00._9_7_ = tt1._9_7_;
          s_00.term._content = tt1.term._content;
          s_00.applicator = tt1.applicator;
          RVar3 = majo(this,s_00,tt2,(TermList *)(tt2.term._content + (ulong)uVar4 * 8 + 0x28),uVar4
                      );
        }
        else if (RVar3 == EQUAL) {
          uVar4 = *(uint *)(TVar1._content + 0xc) & 0xfffffff;
          s.aboveVar = tt1.aboveVar;
          s._9_7_ = tt1._9_7_;
          s.term._content = tt1.term._content;
          s.applicator = tt1.applicator;
          RVar3 = lexMAE(this,s,tt2,(TermList *)(TVar1._content + (ulong)uVar4 * 8 + 0x28),
                         (TermList *)
                         (tt2.term._content +
                          (ulong)(*(uint *)(tt2.term._content + 0xc) & 0xfffffff) * 8 + 0x28),uVar4)
          ;
        }
        else {
          uVar4 = *(uint *)(TVar1._content + 0xc) & 0xfffffff;
          s_01.aboveVar = tt1.aboveVar;
          s_01._9_7_ = tt1._9_7_;
          s_01.term._content = tt1.term._content;
          s_01.applicator = tt1.applicator;
          RVar3 = alpha(this,(TermList *)(TVar1._content + (ulong)uVar4 * 8 + 0x28),uVar4,s_01,tt2);
        }
      }
      else {
        bVar2 = AppliedTerm::containsVar(&tt1,tt2.term);
        RVar3 = (uint)!bVar2 + (uint)!bVar2 * 2 + GREATER;
      }
    }
    else {
      RVar3 = (tt1.term._content != tt2.term._content) + EQUAL;
    }
  }
  return RVar3;
}

Assistant:

Ordering::Result LPO::lpo(AppliedTerm tt1, AppliedTerm tt2) const
{
  if(tt1.equalsShallow(tt2)) {
    return EQUAL;
  }
  if (tt1.term.isVar()) {
    return (tt1.term==tt2.term) ? EQUAL : INCOMPARABLE;
  }

  if (tt2.term.isVar()) {
    return tt1.containsVar(tt2.term) ? GREATER : INCOMPARABLE;
  }

  auto t1=tt1.term.term();
  auto t2=tt2.term.term();

  switch (comparePrecedences(t1, t2)) {
  case EQUAL:
    return lexMAE(tt1, tt2, t1->args(), t2->args(), t1->arity());
  case GREATER:
    return majo(tt1, tt2, t2->args(), t2->arity());
  default:
    return alpha(t1->args(), t1->arity(), tt1, tt2);
  }
}